

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_msl_add_resource_binding_2
          (spvc_compiler compiler,spvc_msl_resource_binding_2 *binding)

{
  spvc_context_s *this;
  undefined1 local_80 [8];
  MSLResourceBinding bind;
  CompilerMSL *msl;
  allocator local_41;
  string local_40;
  spvc_msl_resource_binding_2 *local_20;
  spvc_msl_resource_binding_2 *binding_local;
  spvc_compiler compiler_local;
  
  local_20 = binding;
  binding_local = (spvc_msl_resource_binding_2 *)compiler;
  if (compiler->backend == SPVC_BACKEND_MSL) {
    bind._24_8_ = std::
                  unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
                  get(&compiler->compiler);
    spirv_cross::MSLResourceBinding::MSLResourceBinding((MSLResourceBinding *)local_80);
    bind.basetype = local_20->binding;
    bind.stage = local_20->desc_set;
    local_80._0_4_ = local_20->stage;
    bind.binding = local_20->msl_buffer;
    bind.count = local_20->msl_texture;
    bind.msl_buffer = local_20->msl_sampler;
    bind.desc_set = local_20->count;
    spirv_cross::CompilerMSL::add_msl_resource_binding
              ((CompilerMSL *)bind._24_8_,(MSLResourceBinding *)local_80);
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"MSL function used on a non-MSL backend.",&local_41);
    spvc_context_s::report_error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    compiler_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_msl_add_resource_binding_2(spvc_compiler compiler,
                                                     const spvc_msl_resource_binding_2 *binding)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	MSLResourceBinding bind;
	bind.binding = binding->binding;
	bind.desc_set = binding->desc_set;
	bind.stage = static_cast<spv::ExecutionModel>(binding->stage);
	bind.msl_buffer = binding->msl_buffer;
	bind.msl_texture = binding->msl_texture;
	bind.msl_sampler = binding->msl_sampler;
	bind.count = binding->count;
	msl.add_msl_resource_binding(bind);
	return SPVC_SUCCESS;
#else
	(void)binding;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}